

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift_test.cpp
# Opt level: O0

void read_fvecs(char *filename,float **data,uint32_t *num_vectors,int *dim)

{
  byte bVar1;
  ulong uVar2;
  void *pvVar3;
  uint *in_RCX;
  uint *in_RDX;
  long *in_RSI;
  char *in_RDI;
  size_t i;
  size_t fsize;
  pos_type ss;
  ifstream in;
  ulong local_258;
  fpos local_248 [32];
  char local_228 [520];
  uint *local_20;
  uint *local_18;
  long *local_10;
  char *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  printf("Loading data from %s\n",in_RDI);
  std::ifstream::ifstream(local_228,local_8,_S_bin);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    printf("Cannot open file: %s\n",local_8);
    exit(1);
  }
  std::istream::read(local_228,(long)local_20);
  std::istream::seekg((long)local_228,_S_beg);
  local_248._0_16_ = std::istream::tellg();
  uVar2 = std::fpos::operator_cast_to_long(local_248);
  *local_18 = (uint)(uVar2 / (ulong)(long)(int)(*local_20 + 1) >> 2);
  pvVar3 = operator_new__((ulong)(*local_18 * *local_20) << 2);
  *local_10 = (long)pvVar3;
  std::istream::seekg((long)local_228,_S_beg);
  for (local_258 = 0; local_258 < *local_18; local_258 = local_258 + 1) {
    std::istream::seekg((long)local_228,4);
    std::istream::read(local_228,*local_10 + local_258 * (long)(int)*local_20 * 4);
  }
  std::ifstream::close();
  printf("Data size: (%u, %d)\n",(ulong)*local_18,(ulong)*local_20);
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void read_fvecs(char *filename, float *&data, uint32_t &num_vectors, int &dim) {
  printf("Loading data from %s\n", filename);
  std::ifstream in(filename, std::ios::binary);

  if (!in.is_open()) {
    printf("Cannot open file: %s\n", filename);
    exit(1);
    return;
  }

  // Get #dimensions
  in.read((char *)&dim, 4);

  // Get file size
  in.seekg(0, std::ios::end);
  std::ios::pos_type ss = in.tellg();
  size_t fsize = (size_t)ss;

  // fisze = (4 + 4d) * n
  num_vectors = fsize / (1 + dim) / 4;
  data = new float[num_vectors * dim];

  in.seekg(0, std::ios::beg);
  for (size_t i = 0; i < num_vectors; i++) {
    in.seekg(4, std::ios::cur);
    in.read((char *)(data + i * dim), dim * 4);
  }
  in.close();

  printf("Data size: (%u, %d)\n", num_vectors, dim);
  return;
}